

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cc
# Opt level: O1

bool __thiscall ConfigFile::load(ConfigFile *this,string *path)

{
  char cVar1;
  ssize_t sVar2;
  Stream *this_00;
  size_t in_RCX;
  void *__buf;
  undefined1 uVar3;
  ifstream file;
  undefined1 auStack_248 [8];
  size_type *local_240;
  size_type local_230 [2];
  undefined1 local_220 [520];
  
  std::ifstream::ifstream(local_220,(string *)path,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    local_240 = local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"config","");
    Log::Logger::operator[]((Logger *)auStack_248,(string *)&Log::Error);
    this_00 = Log::Stream::operator<<((Stream *)auStack_248,"Failed to open config file \'");
    std::__ostream_insert<char,std::char_traits<char>>
              (this_00->stream,(path->_M_dataplus)._M_p,path->_M_string_length);
    Log::Stream::operator<<(this_00,"\'");
    Log::Stream::~Stream((Stream *)auStack_248);
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    uVar3 = 0;
  }
  else {
    sVar2 = read(this,(int)local_220,__buf,in_RCX);
    uVar3 = (undefined1)sVar2;
  }
  std::ifstream::~ifstream(local_220);
  return (bool)uVar3;
}

Assistant:

bool
ConfigFile::load(const std::string &path) {
  std::ifstream file(path);
  if (!file.is_open()) {
    Log::Error["config"] << "Failed to open config file '" << path << "'";
    return false;
  }

  return read(&file);
}